

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

bool __thiscall testing::internal::FilePath::CreateFolder(FilePath *this)

{
  long lVar1;
  int iVar2;
  char *__path;
  long in_FS_OFFSET;
  int result;
  FilePath *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __path = (char *)std::__cxx11::string::c_str();
  iVar2 = mkdir(__path,0x1ff);
  if (iVar2 == -1) {
    this_local._7_1_ = DirectoryExists(this);
  }
  else {
    this_local._7_1_ = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_local._7_1_;
  }
  __stack_chk_fail();
}

Assistant:

bool FilePath::CreateFolder() const {
#if GTEST_OS_WINDOWS_MOBILE
  FilePath removed_sep(this->RemoveTrailingPathSeparator());
  LPCWSTR unicode = String::AnsiToUtf16(removed_sep.c_str());
  int result = CreateDirectory(unicode, NULL) ? 0 : -1;
  delete [] unicode;
#elif GTEST_OS_WINDOWS
  int result = _mkdir(pathname_.c_str());
#else
  int result = mkdir(pathname_.c_str(), 0777);
#endif  // GTEST_OS_WINDOWS_MOBILE

  if (result == -1) {
    return this->DirectoryExists();  // An error is OK if the directory exists.
  }
  return true;  // No error.
}